

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::internal_node<int,_true>_> __thiscall
immutable::rrb_details::execute_concat_plan<int,true,5>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<int,_true>_> *all,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size,uint32_t slen,
          uint32_t shift)

{
  uint32_t len;
  ref<immutable::rrb_details::internal_node<int,_true>_> *prVar1;
  value_type vVar2;
  uint uVar3;
  int iVar4;
  internal_node<int,_true> *piVar5;
  const_reference pvVar6;
  leaf_node<int,_true> *plVar7;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_b0;
  uint local_a8;
  uint local_a4;
  uint32_t k_1;
  uint32_t k;
  ref<immutable::rrb_details::internal_node<int,_true>_> old_node_1;
  uint32_t cur_size_1;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_node_1;
  ref<immutable::rrb_details::internal_node<int,_true>_> old_1;
  uint32_t new_size_1;
  uint32_t i_1;
  uint32_t j_1;
  uint32_t j;
  ref<immutable::rrb_details::leaf_node<int,_true>_> old_node;
  uint32_t cur_size;
  ref<immutable::rrb_details::leaf_node<int,_true>_> new_node;
  ref<immutable::rrb_details::leaf_node<int,_true>_> local_48;
  ref<immutable::rrb_details::leaf_node<int,_true>_> old;
  uint local_38;
  uint32_t new_size;
  uint32_t i;
  uint32_t offset;
  uint32_t idx;
  uint32_t shift_local;
  uint32_t slen_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size_local;
  ref<immutable::rrb_details::internal_node<int,_true>_> *all_local;
  ref<immutable::rrb_details::internal_node<int,_true>_> *new_all;
  
  piVar5 = internal_node_create<int,true>(slen);
  ref<immutable::rrb_details::internal_node<int,_true>_>::ref
            ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this,piVar5);
  i = 0;
  new_size = 0;
  if (shift == 5) {
    for (local_38 = 0; local_38 < slen; local_38 = local_38 + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (node_size,(ulong)local_38);
      old.ptr._4_4_ = *pvVar6;
      piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(all);
      ref<immutable::rrb_details::leaf_node<int,true>>::
      ref<immutable::rrb_details::internal_node<int,true>>
                ((ref<immutable::rrb_details::leaf_node<int,true>> *)&local_48,piVar5->child + i);
      vVar2 = old.ptr._4_4_;
      if ((new_size == 0) &&
         (plVar7 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->(&local_48),
         vVar2 == plVar7->len)) {
        i = i + 1;
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this);
        ref<immutable::rrb_details::internal_node<int,true>>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,true>> *)
                   (piVar5->child + local_38),&local_48);
      }
      else {
        plVar7 = leaf_node_create<int,true>(old.ptr._4_4_);
        ref<immutable::rrb_details::leaf_node<int,_true>_>::ref
                  ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)&stack0xffffffffffffffa0,
                   plVar7);
        old_node.ptr._4_4_ = 0;
        while (old_node.ptr._4_4_ < old.ptr._4_4_) {
          piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(all);
          ref<immutable::rrb_details::leaf_node<int,true>>::
          ref<immutable::rrb_details::internal_node<int,true>>
                    ((ref<immutable::rrb_details::leaf_node<int,true>> *)&j_1,piVar5->child + i);
          uVar3 = old.ptr._4_4_ - old_node.ptr._4_4_;
          plVar7 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->
                             ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)&j_1);
          if (uVar3 < plVar7->len - new_size) {
            for (new_size_1 = 0; new_size_1 < old.ptr._4_4_ - old_node.ptr._4_4_;
                new_size_1 = new_size_1 + 1) {
              plVar7 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)&j_1);
              iVar4 = plVar7->child[new_size + new_size_1];
              plVar7 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)
                                  &stack0xffffffffffffffa0);
              plVar7->child[old_node.ptr._4_4_ + new_size_1] = iVar4;
            }
            new_size = (old.ptr._4_4_ - old_node.ptr._4_4_) + new_size;
            old_node.ptr._4_4_ = old.ptr._4_4_;
          }
          else {
            for (i_1 = 0; plVar7 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->
                                             ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)
                                              &j_1), i_1 < plVar7->len - new_size; i_1 = i_1 + 1) {
              plVar7 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)&j_1);
              iVar4 = plVar7->child[new_size + i_1];
              plVar7 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)
                                  &stack0xffffffffffffffa0);
              plVar7->child[old_node.ptr._4_4_ + i_1] = iVar4;
            }
            plVar7 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->
                               ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)&j_1);
            old_node.ptr._4_4_ = (plVar7->len - new_size) + old_node.ptr._4_4_;
            i = i + 1;
            new_size = 0;
          }
          ref<immutable::rrb_details::leaf_node<int,_true>_>::~ref
                    ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)&j_1);
        }
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this);
        ref<immutable::rrb_details::internal_node<int,true>>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,true>> *)
                   (piVar5->child + local_38),
                   (ref<immutable::rrb_details::leaf_node<int,_true>_> *)&stack0xffffffffffffffa0);
        ref<immutable::rrb_details::leaf_node<int,_true>_>::~ref
                  ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)&stack0xffffffffffffffa0);
      }
      ref<immutable::rrb_details::leaf_node<int,_true>_>::~ref(&local_48);
    }
  }
  else {
    for (old_1.ptr._4_4_ = 0; old_1.ptr._4_4_ < slen; old_1.ptr._4_4_ = old_1.ptr._4_4_ + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (node_size,(ulong)old_1.ptr._4_4_);
      len = *pvVar6;
      piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(all);
      ref<immutable::rrb_details::internal_node<int,_true>_>::ref(&new_node_1,piVar5->child + i);
      if ((new_size == 0) &&
         (piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&new_node_1),
         len == piVar5->len)) {
        i = i + 1;
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this);
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                  (piVar5->child + old_1.ptr._4_4_,&new_node_1);
      }
      else {
        piVar5 = internal_node_create<int,true>(len);
        ref<immutable::rrb_details::internal_node<int,_true>_>::ref
                  ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                   &stack0xffffffffffffff70,piVar5);
        old_node_1.ptr._4_4_ = 0;
        while (old_node_1.ptr._4_4_ < len) {
          piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(all);
          ref<immutable::rrb_details::internal_node<int,_true>_>::ref
                    ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&k_1,
                     piVar5->child + i);
          uVar3 = len - old_node_1.ptr._4_4_;
          piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&k_1);
          if (uVar3 < piVar5->len - new_size) {
            for (local_a8 = 0; local_a8 < len - old_node_1.ptr._4_4_; local_a8 = local_a8 + 1) {
              piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&k_1);
              prVar1 = piVar5->child;
              uVar3 = new_size + local_a8;
              piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                                  &stack0xffffffffffffff70);
              ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                        (piVar5->child + (old_node_1.ptr._4_4_ + local_a8),prVar1 + uVar3);
            }
            new_size = (len - old_node_1.ptr._4_4_) + new_size;
            old_node_1.ptr._4_4_ = len;
          }
          else {
            for (local_a4 = 0; uVar3 = local_a4,
                piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                                   ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&k_1),
                uVar3 < piVar5->len - new_size; local_a4 = local_a4 + 1) {
              piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&k_1);
              prVar1 = piVar5->child;
              uVar3 = new_size + local_a4;
              piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                                  &stack0xffffffffffffff70);
              ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                        (piVar5->child + (old_node_1.ptr._4_4_ + local_a4),prVar1 + uVar3);
            }
            piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                               ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&k_1);
            iVar4 = piVar5->len - new_size;
            i = i + 1;
            new_size = 0;
            old_node_1.ptr._4_4_ = iVar4 + old_node_1.ptr._4_4_;
          }
          ref<immutable::rrb_details::internal_node<int,_true>_>::~ref
                    ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&k_1);
        }
        set_sizes<int,true,5>
                  ((rrb_details *)&local_b0,
                   (ref<immutable::rrb_details::internal_node<int,_true>_> *)
                   &stack0xffffffffffffff70,shift - 5);
        ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&local_b0);
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this);
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                  (piVar5->child + old_1.ptr._4_4_,
                   (ref<immutable::rrb_details::internal_node<int,_true>_> *)
                   &stack0xffffffffffffff70);
        ref<immutable::rrb_details::internal_node<int,_true>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                   &stack0xffffffffffffff70);
      }
      ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&new_node_1);
    }
  }
  return (ref<immutable::rrb_details::internal_node<int,_true>_>)(internal_node<int,_true> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> execute_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, const std::vector<uint32_t>& node_size, uint32_t slen, uint32_t shift)
      {
      // the all vector doesn't have sizes set yet.

      ref<internal_node<T, atomic_ref_counting>> new_all = internal_node_create<T, atomic_ref_counting>(slen);
      // Current old node index to copy from
      uint32_t idx = 0;

      // Offset is how long into the current old node we've already copied from
      uint32_t offset = 0;

      if (shift == bits<N>::rrb_bits)
        { // handle leaf nodes here
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<leaf_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            // just pointer copy the node if there is no offset and both have same
            // size
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<leaf_node<T, atomic_ref_counting>> new_node = leaf_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            // cur_size is the current size of the new node
            // (the amount of elements copied into it so far)

            while (cur_size < new_size /*&& idx < all->len*/)
              {
              // the commented out check is verified by create_concat_plan --
              // otherwise the implementation is erroneous!
              ref<leaf_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                // if this node can contain all elements not copied in the old node,
                // copy all of them into this node

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (old_node->len - offset) * sizeof(T));
                for (uint32_t j = 0; j < old_node->len - offset; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                // if this node can't contain all the elements not copied in the old
                // node, copy as many as we can and pass the old node over to the
                // new node after this one.

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (new_size - cur_size) * sizeof(T));
                for (uint32_t j = 0; j < new_size - cur_size; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }

            new_all->child[i] = new_node;
            }
          }
        }
      else
        { // not at lowest non-leaf level
        // this is ALMOST equivalent with the leaf node copying, the only difference
        // is that this is with internal nodes and the fact that they have to create
        // their size tables.

        // As that's the only difference, I won't bother with comments here.
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<internal_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> new_node = internal_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            while (cur_size < new_size)
              {
              ref<internal_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                for (uint32_t k = 0; k < (old_node->len - offset); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                for (uint32_t k = 0; k < (new_size - cur_size); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }
            set_sizes<T, atomic_ref_counting, N>(new_node, shift - bits<N>::rrb_bits); // This is where we set sizes
            new_all->child[i] = new_node;
            }
          }
        }
      return new_all;
      }